

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emit.c
# Opt level: O2

ch_dataptr ch_emit_commit_scope(ch_emit *emit)

{
  ch_emit_scope *blob;
  uint8_t *data_start;
  ch_dataptr cVar1;
  
  blob = emit->emit_scope;
  data_start = (blob->bytecode).start;
  cVar1 = ch_emit_write(&emit->function_bytecode,data_start,
                        (long)(blob->bytecode).current - (long)data_start);
  free_blob(&blob->bytecode);
  emit->emit_scope = emit->emit_scope->parent;
  return cVar1;
}

Assistant:

ch_dataptr ch_emit_commit_scope(ch_emit *emit) {
  // TODO check if function_ptr exceeds UINT32_MAX (of ch_dataptr)
  // TODO check if emit_scope is not NULL

  ch_blob *bytecode = &emit->emit_scope->bytecode;
  ch_dataptr function_ptr = ch_emit_write(
      &emit->function_bytecode, bytecode->start, CH_BLOB_CONTENT_SIZE(bytecode));

  free_blob(bytecode);
  emit->emit_scope = emit->emit_scope->parent;

  return function_ptr;
}